

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsCommon.cpp
# Opt level: O0

void Scs::LogWriteLine(char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_508 [8];
  undefined8 local_500;
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  size_t local_440;
  size_t len;
  char buffer [1024];
  va_list argptr;
  unique_lock<std::mutex> lock;
  char *format_local;
  
  if (in_AL != '\0') {
    local_4d8 = in_XMM0_Qa;
    local_4c8 = in_XMM1_Qa;
    local_4b8 = in_XMM2_Qa;
    local_4a8 = in_XMM3_Qa;
    local_498 = in_XMM4_Qa;
    local_488 = in_XMM5_Qa;
    local_478 = in_XMM6_Qa;
    local_468 = in_XMM7_Qa;
  }
  local_500 = in_RSI;
  local_4f8 = in_RDX;
  local_4f0 = in_RCX;
  local_4e8 = in_R8;
  local_4e0 = in_R9;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&argptr[0].reg_save_area,&s_mutex);
  argptr[0].overflow_arg_area = local_508;
  argptr[0]._0_8_ = &stack0x00000008;
  buffer[0x3fc] = '0';
  buffer[0x3fd] = '\0';
  buffer[0x3fe] = '\0';
  buffer[0x3ff] = '\0';
  buffer[0x3f8] = '\b';
  buffer[0x3f9] = '\0';
  buffer[0x3fa] = '\0';
  buffer[0x3fb] = '\0';
  vsnprintf((char *)&len,0x400,format,buffer + 0x3f8);
  local_440 = strlen((char *)&len);
  if (local_440 < 0x3fe) {
    buffer[local_440 - 8] = '\n';
    buffer[local_440 - 7] = '\0';
  }
  std::function<void_(const_char_*)>::operator()(&s_params.logFn,(char *)&len);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&argptr[0].reg_save_area);
  return;
}

Assistant:

void Scs::LogWriteLine(const char * format, ...)
{
	std::unique_lock<std::mutex> lock(s_mutex);
	va_list argptr;
	va_start(argptr, format);
	char buffer[BufferSize];
#if defined(SCS_WINDOWS)
	_vsnprintf_s(buffer, BufferSize, _TRUNCATE, format, argptr);
#else
	vsnprintf(buffer, BufferSize, format, argptr);
#endif
	size_t len = strlen(buffer);
	if (len < BufferSize - 2)
	{
		buffer[len] = '\n';
		buffer[len + 1] = 0;
	}
	s_params.logFn(buffer);
	va_end(argptr);
}